

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  code *pcVar1;
  long lVar2;
  FILE *__stream;
  usize __envp;
  int iVar3;
  int *piVar4;
  String *pSVar5;
  String *this_00;
  char *pcVar6;
  char *pcVar7;
  int *extraout_RAX;
  char **in_RCX;
  uint in_R8D;
  Map<String,_String> *in_R9;
  char *pcStack_130;
  char *pcStack_128;
  int local_120;
  int local_11c;
  FILE *local_118;
  char *local_110;
  char *local_108;
  Data *local_100;
  String *local_f8;
  undefined1 local_e9;
  Iterator *local_e8;
  Iterator *local_e0;
  usize local_d8;
  undefined1 local_c9;
  Process *local_c8;
  int local_bc;
  undefined4 local_b8;
  int err;
  Iterator IStack_b0;
  int r;
  Iterator end;
  Iterator i_1;
  char **ienv;
  undefined1 local_88 [8];
  Array<String> envStringsBuf;
  char **env;
  char **ppcStack_60;
  int i;
  char **args;
  int stdinFds [2];
  int stderrFds [2];
  int stdoutFds [2];
  Map<String,_String> *environment_local;
  uint streams_local;
  char **argv_local;
  int argc_local;
  String *executable_local;
  Process *this_local;
  
  pSVar5 = (String *)&pcStack_128;
  local_c8 = this;
  if (this->pid != 0) {
    pcStack_130 = (char *)0x107488;
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    this_local._7_1_ = 0;
    goto LAB_001079b8;
  }
  pcStack_130 = (char *)0x1074a7;
  memset(stderrFds,0,8);
  pcStack_130 = (char *)0x1074b7;
  memset(stdinFds,0,8);
  pcStack_130 = (char *)0x1074c7;
  memset(&args,0,8);
  if ((in_R8D & 1) == 0) {
LAB_001074e7:
    if ((in_R8D & 2) != 0) {
      pcStack_130 = (char *)0x1074fb;
      iVar3 = pipe(stdinFds);
      if (iVar3 != 0) goto LAB_0010794c;
    }
    if ((in_R8D & 4) != 0) {
      pcStack_130 = (char *)0x10751b;
      iVar3 = pipe((int *)&args);
      if (iVar3 != 0) goto LAB_0010794c;
    }
    if ((__oflag == 0) || (ppcStack_60 = in_RCX, in_RCX[__oflag + -1] != (char *)0x0)) {
      argv_local._4_4_ = __oflag;
      if (__oflag == 0) {
        argv_local._4_4_ = 1;
      }
      lVar2 = -((long)argv_local._4_4_ * 8 + 0x17U & 0xfffffffffffffff0);
      pSVar5 = (String *)((long)&pcStack_128 + lVar2);
      *(char **)((long)pSVar5 + (long)argv_local._4_4_ * 8) = (char *)0x0;
      for (env._4_4_ = 1; env._4_4_ < argv_local._4_4_; env._4_4_ = env._4_4_ + 1) {
        *(char **)((long)pSVar5 + (long)env._4_4_ * 8) = in_RCX[env._4_4_];
      }
      *(undefined8 *)((long)&pcStack_130 + lVar2) = 0x1075c5;
      pcVar6 = String::operator_cast_to_char_((String *)__file);
      *(char **)pSVar5 = pcVar6;
      ppcStack_60 = (char **)pSVar5;
    }
    envStringsBuf._capacity = _environ;
    *(undefined8 *)((long)pSVar5 + -8) = 0x1075e6;
    Array<String>::Array((Array<String> *)local_88);
    *(undefined8 *)((long)pSVar5 + -8) = 0x1075ef;
    local_c9 = Map<String,_String>::isEmpty(in_R9);
    if (!(bool)local_c9) {
      *(undefined8 *)((long)pSVar5 + -8) = 0x107614;
      anon_unknown.dwarf_5fbe::prepareEnv(in_R9,(Array<String> *)local_88);
      *(undefined8 *)((long)pSVar5 + -8) = 0x10761f;
      local_d8 = Array<String>::size((Array<String> *)local_88);
      pSVar5 = (String *)((long)pSVar5 - (local_d8 * 8 + 0x17 & 0xfffffffffffffff0));
      envStringsBuf._capacity = (usize)pSVar5;
      pSVar5[-1]._data.ref = 0x10765c;
      local_e0 = Array<String>::begin((Array<String> *)local_88);
      end.item = local_e0->item;
      pSVar5[-1]._data.ref = 0x10767f;
      local_e8 = Array<String>::end((Array<String> *)local_88);
      IStack_b0.item = local_e8->item;
      i_1.item = pSVar5;
      while( true ) {
        pSVar5[-1]._data.ref = 0x1076ac;
        local_e9 = Array<String>::Iterator::operator!=(&end,&stack0xffffffffffffff50);
        if (!(bool)local_e9) break;
        pSVar5[-1]._data.ref = 0x1076cc;
        this_00 = Array<String>::Iterator::operator*(&end);
        local_f8 = this_00;
        pSVar5[-1]._data.ref = 0x1076e1;
        local_100 = (Data *)String::operator_cast_to_char_(this_00);
        (i_1.item)->data = local_100;
        pSVar5[-1]._data.ref = 0x107715;
        Array<String>::Iterator::operator++(&end);
        i_1.item = (String *)&(i_1.item)->_data;
      }
      (i_1.item)->data = (Data *)0x0;
    }
    pSVar5[-1]._data.ref = 0x10774c;
    err = vfork();
    iVar3 = stderrFds[1];
    if (err == 0xffffffff) {
      this_local._7_1_ = 0;
    }
    else if (err == 0) {
      if (stderrFds[1] != 0) {
        pSVar5[-1]._data.ref = 0x1077fb;
        dup2(iVar3,1);
        pSVar5[-1]._data.ref = 0x107803;
        ::close(stderrFds[1]);
      }
      iVar3 = stdinFds[1];
      if (stdinFds[1] != 0) {
        pSVar5[-1]._data.ref = 0x10781a;
        dup2(iVar3,2);
        pSVar5[-1]._data.ref = 0x107822;
        ::close(stdinFds[1]);
      }
      iVar3 = (int)args;
      if ((int)args != 0) {
        pSVar5[-1]._data.ref = 0x107836;
        dup2(iVar3,0);
        pSVar5[-1]._data.ref = 0x10783e;
        ::close((int)args);
      }
      if (stderrFds[0] != 0) {
        pSVar5[-1]._data.ref = 0x107850;
        ::close(stderrFds[0]);
      }
      if (stdinFds[0] != 0) {
        pSVar5[-1]._data.ref = 0x107862;
        ::close(stdinFds[0]);
      }
      if (args._4_4_ != 0) {
        pSVar5[-1]._data.ref = 0x107874;
        ::close(args._4_4_);
      }
      pSVar5[-1]._data.ref = 0x107881;
      pcVar6 = String::operator_cast_to_char_((String *)__file);
      __envp = envStringsBuf._capacity;
      local_108 = pcVar6;
      pSVar5[-1]._data.ref = 0x10789e;
      iVar3 = execvpe(pcVar6,ppcStack_60,(char **)__envp);
      if (iVar3 == -1) {
        local_118 = _stderr;
        pSVar5[-1]._data.ref = 0x1078bd;
        local_110 = String::operator_cast_to_char_((String *)__file);
        pSVar5[-1]._data.ref = 0x1078cb;
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        pSVar5[-1]._data.ref = 0x1078d2;
        pcVar7 = strerror(iVar3);
        pcVar6 = local_110;
        __stream = local_118;
        pSVar5[-1]._data.ref = 0x1078f1;
        fprintf(__stream,"%s: %s\n",pcVar6,pcVar7);
        pSVar5[-1]._data.ref = (usize)&UNK_001078fb;
        _exit(1);
      }
      pSVar5[-1]._data.ref = 0x10791e;
      local_11c = Debug::printf("%s:%u: assertion failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x2c5,"false");
      if (local_11c != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_local._7_1_ = 0;
      local_11c = 0;
    }
    else {
      local_c8->pid = err;
      if (stderrFds[1] != 0) {
        pSVar5[-1]._data.ref = 0x107795;
        ::close(stderrFds[1]);
      }
      if (stdinFds[1] != 0) {
        pSVar5[-1]._data.ref = 0x1077a7;
        ::close(stdinFds[1]);
      }
      if ((int)args != 0) {
        pSVar5[-1]._data.ref = 0x1077b9;
        ::close((int)args);
      }
      local_c8->fdStdOutRead = stderrFds[0];
      local_c8->fdStdErrRead = stdinFds[0];
      local_c8->fdStdInWrite = args._4_4_;
      this_local._7_1_ = 1;
    }
    local_b8 = 1;
    pSVar5[-1]._data.ref = 0x10794a;
    Array<String>::~Array((Array<String> *)local_88);
    piVar4 = extraout_RAX;
  }
  else {
    pcStack_130 = (char *)0x1074db;
    iVar3 = pipe(stderrFds);
    if (iVar3 == 0) goto LAB_001074e7;
LAB_0010794c:
    pcStack_130 = (char *)0x107951;
    piVar4 = __errno_location();
    local_bc = *piVar4;
    if (stderrFds[0] != 0) {
      pcStack_130 = (char *)0x107967;
      ::close(stderrFds[0]);
      pcStack_130 = (char *)0x10796f;
      ::close(stderrFds[1]);
    }
    if (stdinFds[0] != 0) {
      pcStack_130 = (char *)0x10797d;
      ::close(stdinFds[0]);
      pcStack_130 = (char *)0x107985;
      ::close(stdinFds[1]);
    }
    if ((int)args != 0) {
      pcStack_130 = (char *)0x107993;
      ::close((int)args);
      pcStack_130 = (char *)0x10799b;
      ::close(args._4_4_);
    }
    local_120 = local_bc;
    pcStack_130 = (char *)0x1079ac;
    piVar4 = __errno_location();
    *piVar4 = local_120;
    this_local._7_1_ = 0;
  }
LAB_001079b8:
  return (int)CONCAT71((int7)((ulong)piVar4 >> 8),this_local._7_1_);
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams, const Map<String, String>& environment)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  {

    // prepare argv of child
    const char** args;
    if (argc && !argv[argc - 1])
      args = (const char**)argv;
    else
    {
      if (!argc)
        ++argc;
      args = (const char**)alloca(sizeof(const char*) * (argc + 1));
      args[argc] = 0;
      for (int i = 1; i < argc; ++i)
        args[i] = argv[i];
      args[0] = executable;
    }

    // prepare env of child
    char** env = ::environ;
    Array<String> envStringsBuf;
    if (!environment.isEmpty())
    {
      prepareEnv(environment, envStringsBuf);
      env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
      char** ienv = env;
      for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
        *(ienv++) = (char*)(const char*)*i;
      *ienv = 0;
    }

    // start process
    {
      int r = vfork();
      if (r == -1)
        return false;
      else if (r != 0) // parent
      {
        pid = r;

        if (stdoutFds[1])
          ::close(stdoutFds[1]);
        if (stderrFds[1])
          ::close(stderrFds[1]);
        if (stdinFds[0])
          ::close(stdinFds[0]);

        fdStdOutRead = stdoutFds[0];
        fdStdErrRead = stderrFds[0];
        fdStdInWrite = stdinFds[1];

        return true;
      }
      else // child
      {
        if (stdoutFds[1])
        {
          dup2(stdoutFds[1], STDOUT_FILENO);
          ::close(stdoutFds[1]);
        }
        if (stderrFds[1])
        {
          dup2(stderrFds[1], STDERR_FILENO);
          ::close(stderrFds[1]);
        }
        if (stdinFds[0])
        {
          dup2(stdinFds[0], STDIN_FILENO);
          ::close(stdinFds[0]);
        }

        if (stdoutFds[0])
          ::close(stdoutFds[0]);
        if (stderrFds[0])
          ::close(stderrFds[0]);
        if (stdinFds[1])
          ::close(stdinFds[1]);

        if (execvpe(executable, (char* const*)args, env) == -1)
        {
          fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
          _exit(EXIT_FAILURE);
        }
        ASSERT(false); // unreachable
        return false;
      }
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}